

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap_stl.hpp
# Opt level: O0

void chaiscript::bootstrap::standard_library::sequence_type<std::__cxx11::string>
               (string *param_1,Module *m)

{
  Module *this;
  allocator<char> local_a1;
  string local_a0;
  _func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_int *local_80;
  Proxy_Function local_78 [2];
  undefined1 local_51;
  string local_50;
  _func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_int_char_ptr
  *local_30;
  Proxy_Function local_28;
  Module *local_18;
  Module *m_local;
  string *param_0_local;
  
  local_30 = detail::insert_at<std::__cxx11::string>;
  local_18 = m;
  m_local = (Module *)param_1;
  fun<void(*)(std::__cxx11::string&,int,char_const&)>((chaiscript *)&local_28,&local_30);
  sequence_type<std::__cxx11::string>(std::__cxx11::string_const&,chaiscript::Module&)::{lambda()#1}
  ::operator()[abi_cxx11_(&local_50,&local_51);
  Module::add(m,&local_28,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_28);
  this = local_18;
  local_80 = detail::erase_at<std::__cxx11::string>;
  fun<void(*)(std::__cxx11::string&,int)>((chaiscript *)local_78,&local_80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"erase_at",&local_a1);
  Module::add(this,local_78,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(local_78);
  return;
}

Assistant:

void sequence_type(const std::string & /*type*/, Module &m) {
    m.add(fun(&detail::insert_at<ContainerType>), []() -> std::string {
      if (typeid(typename ContainerType::value_type) == typeid(Boxed_Value)) {
        return "insert_ref_at";
      } else {
        return "insert_at";
      }
    }());

    m.add(fun(&detail::erase_at<ContainerType>), "erase_at");
  }